

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.h
# Opt level: O2

void wait_set_reg32(uint8_t *addr,int reg,uint32_t mask)

{
  while ((~*(uint *)(addr + reg) & mask) != 0) {
    fprintf(_stderr,
            "[DEBUG] %s:%d %s(): waiting for flags 0x%08X in register 0x%05X, current value 0x%08X\n"
            ,"/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/device.h",
            0x84,"wait_set_reg32",(ulong)mask,(ulong)(uint)reg,(ulong)*(uint *)(addr + reg));
    usleep(10000);
  }
  return;
}

Assistant:

static inline void wait_set_reg32(const uint8_t* addr, int reg, uint32_t mask) {
	__asm__ volatile ("" : : : "memory");
	uint32_t cur = 0;
	while (cur = *((volatile uint32_t*) (addr + reg)), (cur & mask) != mask) {
		debug("waiting for flags 0x%08X in register 0x%05X, current value 0x%08X", mask, reg, cur);
		usleep(10000);
		__asm__ volatile ("" : : : "memory");
	}
}